

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Choice.cxx
# Opt level: O0

void __thiscall Fl_Choice::draw(Fl_Choice *this)

{
  undefined4 h;
  undefined4 w;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_Color FVar6;
  Fl_Color FVar7;
  Fl_Boxtype FVar8;
  char *pcVar9;
  Fl_Menu_Item *pFVar10;
  Fl_Widget *pFVar11;
  int local_11c;
  Fl_Color local_110;
  Fl_Fontsize local_10c;
  Fl_Font local_108;
  Fl_Color local_104;
  Fl_Color local_e0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined1 local_b0 [8];
  Fl_Label l;
  int hh;
  int ww;
  int yy;
  int xx;
  Fl_Menu_Item m;
  int y1;
  int x1;
  int w1;
  int Y;
  int X;
  int W;
  int H;
  int dy;
  int dx;
  Fl_Boxtype btype;
  Fl_Choice *this_local;
  
  pcVar9 = Fl::scheme();
  FVar8 = FL_DOWN_BOX;
  if (pcVar9 != (char *)0x0) {
    FVar8 = FL_UP_BOX;
  }
  iVar1 = Fl::box_dx(FVar8);
  iVar2 = Fl::box_dy(FVar8);
  iVar3 = Fl_Widget::h((Fl_Widget *)this);
  iVar3 = iVar3 + iVar2 * -2;
  iVar4 = Fl::is_scheme("gtk+");
  if (iVar4 == 0) {
    iVar4 = Fl::is_scheme("gleam");
    if (iVar4 == 0) {
      iVar4 = Fl::is_scheme("plastic");
      if (iVar4 == 0) {
        local_cc = iVar3;
        if (0x14 < iVar3) {
          local_cc = 0x14;
        }
        local_c8 = local_cc;
      }
      else {
        local_c4 = iVar3;
        if (0x14 < iVar3) {
          local_c4 = 0x14;
        }
        local_c8 = local_c4;
      }
      local_c0 = local_c8;
    }
    else {
      local_c0 = 0x14;
    }
    local_bc = local_c0;
  }
  else {
    local_bc = 0x14;
  }
  iVar4 = Fl_Widget::x((Fl_Widget *)this);
  iVar5 = Fl_Widget::w((Fl_Widget *)this);
  iVar4 = ((iVar4 + iVar5) - local_bc) - iVar1;
  iVar5 = Fl_Widget::y((Fl_Widget *)this);
  y1 = (local_bc + -4) / 3;
  if (y1 < 1) {
    y1 = 1;
  }
  m._52_4_ = iVar4 + (local_bc + y1 * -2 + -1) / 2;
  m.labelcolor_ = iVar5 + iVar2 + ((iVar3 - y1) + -1) / 2;
  pcVar9 = Fl::scheme();
  if (pcVar9 == (char *)0x0) {
    FVar6 = Fl_Menu_::textcolor(&this->super_Fl_Menu_);
    FVar6 = fl_contrast(FVar6,7);
    FVar7 = Fl_Menu_::textcolor(&this->super_Fl_Menu_);
    if (FVar6 == FVar7) {
      Fl_Widget::draw_box((Fl_Widget *)this,FVar8,7);
    }
    else {
      FVar6 = Fl_Widget::color((Fl_Widget *)this);
      FVar6 = fl_lighter(FVar6);
      Fl_Widget::draw_box((Fl_Widget *)this,FVar8,FVar6);
    }
    FVar6 = Fl_Widget::color((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,FL_UP_BOX,iVar4,iVar5 + iVar2,local_bc,iVar3,FVar6);
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar4 == 0) {
      FVar6 = Fl_Widget::labelcolor((Fl_Widget *)this);
      local_104 = fl_inactive(FVar6);
    }
    else {
      local_104 = Fl_Widget::labelcolor((Fl_Widget *)this);
    }
    fl_color(local_104);
    fl_polygon(m._52_4_,m.labelcolor_,m._52_4_ + y1,m.labelcolor_ + y1,m._52_4_ + y1 * 2,
               m.labelcolor_);
  }
  else {
    FVar6 = Fl_Widget::color((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,FVar8,FVar6);
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar4 == 0) {
      FVar6 = Fl_Widget::labelcolor((Fl_Widget *)this);
      local_e0 = fl_inactive(FVar6);
    }
    else {
      local_e0 = Fl_Widget::labelcolor((Fl_Widget *)this);
    }
    fl_color(local_e0);
    iVar4 = Fl::is_scheme("plastic");
    if (iVar4 == 0) {
      iVar4 = Fl_Widget::x((Fl_Widget *)this);
      iVar5 = Fl_Widget::w((Fl_Widget *)this);
      m._52_4_ = (iVar4 + iVar5 + -0xd) - iVar1;
      iVar4 = Fl_Widget::y((Fl_Widget *)this);
      iVar5 = Fl_Widget::h((Fl_Widget *)this);
      m.labelcolor_ = iVar4 + iVar5 / 2;
      fl_polygon(m._52_4_,m.labelcolor_ - 2,m._52_4_ + 3,m.labelcolor_ - 5,m._52_4_ + 6,
                 m.labelcolor_ - 2);
      fl_polygon(m._52_4_,m.labelcolor_ + 2,m._52_4_ + 3,m.labelcolor_ + 5,m._52_4_ + 6,
                 m.labelcolor_ + 2);
      FVar6 = Fl_Widget::color((Fl_Widget *)this);
      FVar6 = fl_darker(FVar6);
      fl_color(FVar6);
      fl_yxline(m._52_4_ + -7,m.labelcolor_ - 8,m.labelcolor_ + 8);
      FVar6 = Fl_Widget::color((Fl_Widget *)this);
      FVar6 = fl_lighter(FVar6);
      fl_color(FVar6);
      fl_yxline(m._52_4_ + -6,m.labelcolor_ - 8,m.labelcolor_ + 8);
    }
    else {
      fl_polygon(m._52_4_,m.labelcolor_ + 3,m._52_4_ + y1,m.labelcolor_ + y1 + 3,m._52_4_ + y1 * 2,
                 m.labelcolor_ + 3);
      fl_polygon(m._52_4_,m.labelcolor_ + 1,m._52_4_ + y1,(m.labelcolor_ - y1) + 1,m._52_4_ + y1 * 2
                 ,m.labelcolor_ + 1);
    }
  }
  pFVar10 = Fl_Menu_::mvalue(&this->super_Fl_Menu_);
  if (pFVar10 != (Fl_Menu_Item *)0x0) {
    pFVar10 = Fl_Menu_::mvalue(&this->super_Fl_Menu_);
    memcpy(&yy,pFVar10,0x38);
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar4 == 0) {
      Fl_Menu_Item::deactivate((Fl_Menu_Item *)&yy);
    }
    else {
      Fl_Menu_Item::activate((Fl_Menu_Item *)&yy);
    }
    iVar4 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = iVar4 + iVar1;
    iVar5 = Fl_Widget::y((Fl_Widget *)this);
    iVar2 = iVar5 + iVar2 + 1;
    iVar5 = Fl_Widget::w((Fl_Widget *)this);
    l._44_4_ = iVar5 - (iVar1 * 2 + local_bc);
    l._40_4_ = iVar3 + -2;
    fl_push_clip(iVar4,iVar2,l._44_4_,l._40_4_);
    pcVar9 = Fl::scheme();
    w = l._44_4_;
    h = l._40_4_;
    if (pcVar9 == (char *)0x0) {
      fl_draw_shortcut = '\x02';
      pFVar11 = Fl::focus();
      Fl_Menu_Item::draw((Fl_Menu_Item *)&yy,iVar4,iVar2,w,h,&this->super_Fl_Menu_,
                         (uint)(pFVar11 == (Fl_Widget *)this));
      fl_draw_shortcut = '\0';
    }
    else {
      local_b0 = (undefined1  [8])_yy;
      l.value = (char *)0x0;
      l.image = (Fl_Image *)0x0;
      l.color._0_1_ = m.user_data_._4_1_;
      if ((m._36_4_ == 0) && (m.flags == 0)) {
        local_108 = Fl_Menu_::textfont(&this->super_Fl_Menu_);
      }
      else {
        local_108 = m.flags;
      }
      l.deimage._0_4_ = local_108;
      if (m._36_4_ == 0) {
        local_10c = Fl_Menu_::textsize(&this->super_Fl_Menu_);
      }
      else {
        local_10c = m._36_4_;
      }
      l.deimage._4_4_ = local_10c;
      if (m.labelfont_ == 0) {
        local_110 = Fl_Menu_::textcolor(&this->super_Fl_Menu_);
      }
      else {
        local_110 = m.labelfont_;
      }
      l.font = local_110;
      iVar1 = Fl_Menu_Item::active((Fl_Menu_Item *)&yy);
      if (iVar1 == 0) {
        l.font = fl_inactive(l.font);
      }
      fl_draw_shortcut = '\x02';
      if ((int)l._44_4_ < 7) {
        local_11c = 0;
      }
      else {
        local_11c = l._44_4_ + -6;
      }
      Fl_Label::draw((Fl_Label *)local_b0,iVar4 + 3,iVar2,local_11c,l._40_4_,4);
      fl_draw_shortcut = '\0';
      pFVar11 = Fl::focus();
      if (pFVar11 == (Fl_Widget *)this) {
        FVar8 = Fl_Widget::box((Fl_Widget *)this);
        Fl_Widget::draw_focus((Fl_Widget *)this,FVar8,iVar4,iVar2,l._44_4_,l._40_4_);
      }
    }
    fl_pop_clip();
  }
  Fl_Widget::draw_label((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Choice::draw() {
  Fl_Boxtype btype = Fl::scheme() ? FL_UP_BOX		// non-default uses up box
                                  : FL_DOWN_BOX;	// default scheme uses down box
  int dx = Fl::box_dx(btype);
  int dy = Fl::box_dy(btype);

  // Arrow area
  int H = h() - 2 * dy;
  int W = Fl::is_scheme("gtk+")    ? 20 :			// gtk+  -- fixed size
          Fl::is_scheme("gleam")   ? 20 :			// gleam -- fixed size
          Fl::is_scheme("plastic") ? ((H > 20) ? 20 : H)	// plastic: shrink if H<20
                                   : ((H > 20) ? 20 : H);	// default: shrink if H<20
  int X = x() + w() - W - dx;
  int Y = y() + dy;

  // Arrow object
  int w1 = (W - 4) / 3; if (w1 < 1) w1 = 1;
  int x1 = X + (W - 2 * w1 - 1) / 2;
  int y1 = Y + (H - w1 - 1) / 2;

  if (Fl::scheme()) {
    // NON-DEFAULT SCHEME

    // Draw widget box
    draw_box(btype, color());

    // Draw arrow area
    fl_color(active_r() ? labelcolor() : fl_inactive(labelcolor()));
    if (Fl::is_scheme("plastic")) {
      // Show larger up/down arrows...
      fl_polygon(x1, y1 + 3, x1 + w1, y1 + w1 + 3, x1 + 2 * w1, y1 + 3);
      fl_polygon(x1, y1 + 1, x1 + w1, y1 - w1 + 1, x1 + 2 * w1, y1 + 1);
    } else {
      // Show smaller up/down arrows with a divider...
      x1 = x() + w() - 13 - dx;
      y1 = y() + h() / 2;
      fl_polygon(x1, y1 - 2, x1 + 3, y1 - 5, x1 + 6, y1 - 2);
      fl_polygon(x1, y1 + 2, x1 + 3, y1 + 5, x1 + 6, y1 + 2);

      fl_color(fl_darker(color()));
      fl_yxline(x1 - 7, y1 - 8, y1 + 8);

      fl_color(fl_lighter(color()));
      fl_yxline(x1 - 6, y1 - 8, y1 + 8);
    }
  } else {
    // DEFAULT SCHEME

    // Draw widget box
    if (fl_contrast(textcolor(), FL_BACKGROUND2_COLOR) == textcolor()) {
      draw_box(btype, FL_BACKGROUND2_COLOR);
    } else {
      draw_box(btype, fl_lighter(color()));
    }

    // Draw arrow area
    draw_box(FL_UP_BOX,X,Y,W,H,color());
    fl_color(active_r() ? labelcolor() : fl_inactive(labelcolor()));
    fl_polygon(x1, y1, x1 + w1, y1 + w1, x1 + 2 * w1, y1);
  }

  W += 2 * dx;

  // Draw menu item's label
  if (mvalue()) {
    Fl_Menu_Item m = *mvalue();
    if (active_r()) m.activate(); else m.deactivate();

    // Clip
    int xx = x() + dx, yy = y() + dy + 1, ww = w() - W, hh = H - 2;
    fl_push_clip(xx, yy, ww, hh);

    if ( Fl::scheme()) {
      Fl_Label l;
      l.value = m.text;
      l.image = 0;
      l.deimage = 0;
      l.type = m.labeltype_;
      l.font = m.labelsize_ || m.labelfont_ ? m.labelfont_ : textfont();
      l.size = m.labelsize_ ? m.labelsize_ : textsize();
      l.color= m.labelcolor_ ? m.labelcolor_ : textcolor();
      if (!m.active()) l.color = fl_inactive((Fl_Color)l.color);
      fl_draw_shortcut = 2; // hack value to make '&' disappear
      l.draw(xx+3, yy, ww>6 ? ww-6 : 0, hh, FL_ALIGN_LEFT);
      fl_draw_shortcut = 0;
      if ( Fl::focus() == this ) draw_focus(box(), xx, yy, ww, hh);
    }
    else {
      fl_draw_shortcut = 2; // hack value to make '&' disappear
      m.draw(xx, yy, ww, hh, this, Fl::focus() == this);
      fl_draw_shortcut = 0;
    }

    fl_pop_clip();
  }

  // Widget's label
  draw_label();
}